

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O1

void __thiscall WorldShuffler::randomize_where_is_lithograph_hint(WorldShuffler *this)

{
  HintSource *pHVar1;
  RandomizerWorld *this_00;
  HintSource *this_01;
  mapped_type *ppIVar2;
  ostream *poVar3;
  stringstream where_is_litho_hint;
  key_type_conflict local_1c9;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [7];
  ios_base local_128 [264];
  
  if (this->_options->_archipelago_world == false) {
    this_00 = this->_world;
    pHVar1 = (HintSource *)(local_1a8 + 0x10);
    local_1a8._0_8_ = pHVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"King Nole\'s Cave sign","")
    ;
    this_01 = RandomizerWorld::hint_source(this_00,(string *)local_1a8);
    if ((HintSource *)local_1a8._0_8_ != pHVar1) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    local_1a8._0_8_ = this_01;
    std::vector<HintSource*,std::allocator<HintSource*>>::emplace_back<HintSource*&>
              ((vector<HintSource*,std::allocator<HintSource*>> *)&this->_world->_used_hint_sources,
               (HintSource **)local_1a8);
    HintSource::text_abi_cxx11_((string *)local_1a8,this_01);
    if ((HintSource *)local_1a8._0_8_ != pHVar1) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    if (local_1a8._8_8_ == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8 + 0x10),
                 "The lithograph will help you finding the jewels. It is ",0x37);
      local_1c9 = '\'';
      ppIVar2 = std::
                map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                      *)this->_world,&local_1c9);
      random_hint_for_item_abi_cxx11_(&local_1c8,this,*ppIVar2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1a8 + 0x10),local_1c8._M_dataplus._M_p,
                          local_1c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&this_01->_text,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base(local_128);
    }
  }
  return;
}

Assistant:

void WorldShuffler::randomize_where_is_lithograph_hint()
{
    if(_options.archipelago_world())
        return;

    HintSource* knc_sign_source = _world.hint_source("King Nole's Cave sign");

    _world.add_used_hint_source(knc_sign_source);

    if(!knc_sign_source->text().empty())
        return;

    std::stringstream where_is_litho_hint;
    where_is_litho_hint << "The lithograph will help you finding the jewels. It is "
                        << this->random_hint_for_item(_world.item(ITEM_LITHOGRAPH))
                        << ".";

    knc_sign_source->text(where_is_litho_hint.str());
}